

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O0

bool __thiscall
findstr::writeresult
          (findstr *this,string *origin,char *bufstart,uint64_t offset,char *first,char *last)

{
  stopsearch *this_00;
  long local_b0;
  Hexdumper<unsigned_char> local_a8;
  char *local_98 [3];
  string local_80;
  char *local_60;
  Hexdumper<unsigned_char> local_58;
  char *local_48;
  char *local_40;
  char *last_local;
  char *first_local;
  uint64_t offset_local;
  char *bufstart_local;
  string *origin_local;
  findstr *this_local;
  
  this->matchcount = this->matchcount + 1;
  if ((this->count_only & 1U) == 0) {
    local_40 = last;
    last_local = first;
    first_local = (char *)offset;
    offset_local = (uint64_t)bufstart;
    bufstart_local = (char *)origin;
    origin_local = (string *)this;
    if ((this->list_only & 1U) == 0) {
      if (this->verbose == 0) {
        if ((this->nameprinted & 1U) == 0) {
          print<std::__cxx11::string_const&>("%s\n\t",origin);
        }
        else {
          print<>(", ");
        }
        local_b0 = (long)(first_local + (long)last_local) - offset_local;
        print<long>("%08x",&local_b0);
        this->nameprinted = true;
      }
      else if ((this->matchbinary & 1U) == 0) {
        if ((this->pattern_is_guid & 1U) == 0) {
          local_98[0] = first + (offset - (long)bufstart);
          local_a8 = Hex::dumper<unsigned_char>((uchar *)first,(long)last - (long)first);
          print<std::__cxx11::string_const&,long,Hex::Hexdumper<unsigned_char>>
                    ("%s %08x %+b\n",origin,(long *)local_98,&local_a8);
        }
        else {
          local_60 = first + (offset - (long)bufstart);
          guidstring_abi_cxx11_(&local_80,(findstr *)first,(uint8_t *)bufstart);
          print<std::__cxx11::string_const&,long,std::__cxx11::string>
                    ("%s %08x %s\n",origin,(long *)&local_60,&local_80);
          std::__cxx11::string::~string((string *)&local_80);
        }
      }
      else {
        local_48 = first + (offset - (long)bufstart);
        local_58 = Hex::dumper<unsigned_char>((uchar *)first,(long)last - (long)first);
        print<std::__cxx11::string_const&,long,Hex::Hexdumper<unsigned_char>>
                  ("%s %08x %-b\n",origin,(long *)&local_48,&local_58);
      }
      if ((this->firstmatch & 1U) != 0) {
        this_00 = (stopsearch *)__cxa_allocate_exception(8);
        memset(this_00,0,8);
        stopsearch::stopsearch(this_00);
        __cxa_throw(this_00,&stopsearch::typeinfo,stopsearch::~stopsearch);
      }
      if ((this->matchstart & 1U) == 0) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      print<std::__cxx11::string_const&>("%s\n",origin);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool writeresult(const std::string& origin, const char *bufstart, uint64_t offset, const char *first, const char *last)
    {
        matchcount++;
        if (count_only)
            return true;
        if (list_only) {
            print("%s\n", origin);
            return false;
        }
        else if (verbose) {
            if (matchbinary)
                print("%s %08x %-b\n", origin, offset + first - bufstart, Hex::dumper((const uint8_t*)first, last - first));
            else if (pattern_is_guid)
                print("%s %08x %s\n", origin, offset + first - bufstart, guidstring((const uint8_t*)first));
            else // TODO: add option to output the actual string, instead of the current 'ascdump'
                print("%s %08x %+b\n", origin, offset + first - bufstart, Hex::dumper((const uint8_t*)first, last - first));
        }
        else {
            if (!nameprinted) {
                print("%s\n\t", origin);
            }
            else {
                print(", ");
            }
            print("%08x", offset + first - bufstart);
            nameprinted = true;
        }
        if (firstmatch)
            throw stopsearch();
        if (matchstart) {
            return false;
        }
        return true;
    }